

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O3

void disas_crypto_three_reg_sha512(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *s_00;
  TCGContext_conflict1 *pTVar1;
  bool bVar2;
  uint uVar3;
  TCGTemp *pTVar4;
  TCGTemp *pTVar5;
  TCGv_i64 ret;
  TCGv_i64 ret_00;
  code *pcVar6;
  TCGContext_conflict1 *tcg_ctx_3;
  uintptr_t o_4;
  TCGv_i64 *ppTVar7;
  int iVar8;
  uintptr_t o;
  TCGv_i64 pTVar9;
  ulong uVar10;
  bool bVar11;
  uint uVar12;
  uintptr_t o_3;
  uintptr_t o_2;
  TCGv_i64 arg1;
  TCGv_i64 local_40;
  TCGv_i64 local_38;
  
  s_00 = s->uc->tcg_ctx;
  uVar3 = insn >> 10 & 3;
  if ((insn >> 0xe & 1) == 0) {
    switch(uVar3) {
    case 0:
      if ((s->isar->id_aa64isar0 & 0xe000) == 0) goto switchD_006ae9ba_caseD_3;
      pcVar6 = gen_helper_crypto_sha512h;
      break;
    case 1:
      if ((s->isar->id_aa64isar0 & 0xe000) == 0) goto switchD_006ae9ba_caseD_3;
      pcVar6 = gen_helper_crypto_sha512h2;
      break;
    case 2:
      if ((s->isar->id_aa64isar0 & 0xe000) == 0) goto switchD_006ae9ba_caseD_3;
      pcVar6 = gen_helper_crypto_sha512su1;
      break;
    case 3:
      if ((s->isar->id_aa64isar0 & 0xf00000000) == 0) goto switchD_006ae9ba_caseD_3;
      bVar2 = true;
      pcVar6 = (code *)0x0;
      goto LAB_006aea37;
    }
  }
  else {
    switch(uVar3) {
    case 0:
      if ((s->isar->id_aa64isar0 & 0xf000000000) == 0) goto switchD_006ae9ba_caseD_3;
      pcVar6 = gen_helper_crypto_sm3partw1;
      break;
    case 1:
      if ((s->isar->id_aa64isar0 & 0xf000000000) == 0) goto switchD_006ae9ba_caseD_3;
      pcVar6 = gen_helper_crypto_sm3partw2;
      break;
    case 2:
      if ((s->isar->id_aa64isar0 & 0xf0000000000) == 0) goto switchD_006ae9ba_caseD_3;
      pcVar6 = gen_helper_crypto_sm4ekey;
      break;
    case 3:
switchD_006ae9ba_caseD_3:
      unallocated_encoding_aarch64(s);
      return;
    }
  }
  bVar2 = false;
LAB_006aea37:
  if (s->fp_access_checked == true) {
    __assert_fail("!s->fp_access_checked",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                  ,0x487,"_Bool fp_access_check(DisasContext *)");
  }
  s->fp_access_checked = true;
  if (s->fp_excp_el != 0) {
    gen_exception_insn(s,s->pc_curr,1,0x1fe0000a,s->fp_excp_el);
    return;
  }
  uVar3 = insn >> 0x10 & 0x1f;
  uVar12 = insn >> 5 & 0x1f;
  if (bVar2) {
    uVar10 = 0;
    pTVar4 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
    pTVar5 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
    arg1 = (TCGv_i64)((long)pTVar5 - (long)s_00);
    pTVar5 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
    ret = (TCGv_i64)((long)pTVar5 - (long)s_00);
    ppTVar7 = &local_38;
    local_38 = ret;
    pTVar5 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
    ret_00 = (TCGv_i64)((long)pTVar5 - (long)s_00);
    bVar2 = true;
    local_40 = ret_00;
    do {
      bVar11 = bVar2;
      pTVar1 = s->uc->tcg_ctx;
      tcg_gen_op3_aarch64(pTVar1,INDEX_op_ld_i64,(long)pTVar1 + ((long)pTVar4 - (long)s_00),
                          (TCGArg)(pTVar1->cpu_env + (long)pTVar1),uVar10 | uVar12 * 0x100 + 0xc10);
      pTVar1 = s->uc->tcg_ctx;
      tcg_gen_op3_aarch64(pTVar1,INDEX_op_ld_i64,(TCGArg)((long)pTVar1 + (long)arg1),
                          (TCGArg)(pTVar1->cpu_env + (long)pTVar1),uVar10 | uVar3 * 0x100 + 0xc10);
      pTVar9 = *ppTVar7;
      tcg_gen_rotli_i64_aarch64(s_00,pTVar9,arg1,1);
      pTVar9 = pTVar9 + (long)s_00;
      tcg_gen_op3_aarch64(s_00,INDEX_op_xor_i64,(TCGArg)pTVar9,(TCGArg)pTVar9,(TCGArg)pTVar4);
      uVar10 = 8;
      ppTVar7 = &local_40;
      bVar2 = false;
    } while (bVar11);
    pTVar1 = s->uc->tcg_ctx;
    iVar8 = (insn & 0x1f) * 0x100;
    tcg_gen_op3_aarch64(pTVar1,INDEX_op_st_i64,(TCGArg)((long)pTVar1 + (long)ret),
                        (TCGArg)(pTVar1->cpu_env + (long)pTVar1),(ulong)(iVar8 + 0xc10));
    pTVar1 = s->uc->tcg_ctx;
    tcg_gen_op3_aarch64(pTVar1,INDEX_op_st_i64,(TCGArg)((long)pTVar1 + (long)ret_00),
                        (TCGArg)(pTVar1->cpu_env + (long)pTVar1),(ulong)(iVar8 + 0xc18));
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(((long)pTVar4 - (long)s_00) + (long)s_00));
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(arg1 + (long)s_00));
  }
  else {
    pTVar4 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
    tcg_gen_addi_i64_aarch64
              (s_00,(TCGv_i64)((long)pTVar4 - (long)s_00),(TCGv_i64)s_00->cpu_env,
               (ulong)((insn & 0x1f) * 0x100 + 0xc10));
    pTVar1 = s->uc->tcg_ctx;
    pTVar5 = tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I64,false);
    ret = (TCGv_i64)((long)pTVar5 - (long)pTVar1);
    tcg_gen_addi_i64_aarch64(pTVar1,ret,(TCGv_i64)pTVar1->cpu_env,(ulong)(uVar12 * 0x100 + 0xc10));
    pTVar1 = s->uc->tcg_ctx;
    pTVar5 = tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I64,false);
    ret_00 = (TCGv_i64)((long)pTVar5 - (long)pTVar1);
    tcg_gen_addi_i64_aarch64(pTVar1,ret_00,(TCGv_i64)pTVar1->cpu_env,(ulong)(uVar3 * 0x100 + 0xc10))
    ;
    (*pcVar6)(s_00,(TCGv_i64)((long)pTVar4 - (long)s_00),ret,ret_00);
    tcg_temp_free_internal_aarch64(s_00,pTVar4);
  }
  tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(ret + (long)s_00));
  tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(ret_00 + (long)s_00));
  return;
}

Assistant:

static void disas_crypto_three_reg_sha512(DisasContext *s, uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int opcode = extract32(insn, 10, 2);
    int o =  extract32(insn, 14, 1);
    int rm = extract32(insn, 16, 5);
    int rn = extract32(insn, 5, 5);
    int rd = extract32(insn, 0, 5);
    bool feature;
    CryptoThreeOpFn *genfn;

    if (o == 0) {
        switch (opcode) {
        case 0: /* SHA512H */
            feature = dc_isar_feature(aa64_sha512, s);
            genfn = gen_helper_crypto_sha512h;
            break;
        case 1: /* SHA512H2 */
            feature = dc_isar_feature(aa64_sha512, s);
            genfn = gen_helper_crypto_sha512h2;
            break;
        case 2: /* SHA512SU1 */
            feature = dc_isar_feature(aa64_sha512, s);
            genfn = gen_helper_crypto_sha512su1;
            break;
        case 3: /* RAX1 */
            feature = dc_isar_feature(aa64_sha3, s);
            genfn = NULL;
            break;
        default:
            g_assert_not_reached();
        }
    } else {
        switch (opcode) {
        case 0: /* SM3PARTW1 */
            feature = dc_isar_feature(aa64_sm3, s);
            genfn = gen_helper_crypto_sm3partw1;
            break;
        case 1: /* SM3PARTW2 */
            feature = dc_isar_feature(aa64_sm3, s);
            genfn = gen_helper_crypto_sm3partw2;
            break;
        case 2: /* SM4EKEY */
            feature = dc_isar_feature(aa64_sm4, s);
            genfn = gen_helper_crypto_sm4ekey;
            break;
        default:
            unallocated_encoding(s);
            return;
        }
    }

    if (!feature) {
        unallocated_encoding(s);
        return;
    }

    if (!fp_access_check(s)) {
        return;
    }

    if (genfn) {
        TCGv_ptr tcg_rd_ptr, tcg_rn_ptr, tcg_rm_ptr;

        tcg_rd_ptr = vec_full_reg_ptr(s, rd);
        tcg_rn_ptr = vec_full_reg_ptr(s, rn);
        tcg_rm_ptr = vec_full_reg_ptr(s, rm);

        genfn(tcg_ctx, tcg_rd_ptr, tcg_rn_ptr, tcg_rm_ptr);

        tcg_temp_free_ptr(tcg_ctx, tcg_rd_ptr);
        tcg_temp_free_ptr(tcg_ctx, tcg_rn_ptr);
        tcg_temp_free_ptr(tcg_ctx, tcg_rm_ptr);
    } else {
        TCGv_i64 tcg_op1, tcg_op2, tcg_res[2];
        int pass;

        tcg_op1 = tcg_temp_new_i64(tcg_ctx);
        tcg_op2 = tcg_temp_new_i64(tcg_ctx);
        tcg_res[0] = tcg_temp_new_i64(tcg_ctx);
        tcg_res[1] = tcg_temp_new_i64(tcg_ctx);

        for (pass = 0; pass < 2; pass++) {
            read_vec_element(s, tcg_op1, rn, pass, MO_64);
            read_vec_element(s, tcg_op2, rm, pass, MO_64);

            tcg_gen_rotli_i64(tcg_ctx, tcg_res[pass], tcg_op2, 1);
            tcg_gen_xor_i64(tcg_ctx, tcg_res[pass], tcg_res[pass], tcg_op1);
        }
        write_vec_element(s, tcg_res[0], rd, 0, MO_64);
        write_vec_element(s, tcg_res[1], rd, 1, MO_64);

        tcg_temp_free_i64(tcg_ctx, tcg_op1);
        tcg_temp_free_i64(tcg_ctx, tcg_op2);
        tcg_temp_free_i64(tcg_ctx, tcg_res[0]);
        tcg_temp_free_i64(tcg_ctx, tcg_res[1]);
    }
}